

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  size_t i;
  long lVar2;
  long *plVar3;
  int *piVar4;
  void *pvVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  size_t min;
  long *plVar8;
  ulong uVar9;
  char signature [8];
  ssize_t avail;
  long local_40;
  ssize_t local_38;
  
  if (L'\x1e' < best_bid) {
    return L'\xffffffff';
  }
  lVar2 = 0;
  do {
    *(byte *)((long)&local_40 + lVar2) = rar5_signature_xor[lVar2] ^ 0xa1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  local_38 = -1;
  plVar3 = (long *)__archive_read_ahead(a,8,&local_38);
  if (plVar3 == (long *)0x0) {
    wVar6 = L'\xffffffff';
  }
  else {
    wVar6 = -(uint)(local_40 != *plVar3) | 0x1e;
  }
  if (L'\xffffffff' < wVar6) {
    return wVar6;
  }
  piVar4 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  wVar6 = L'\xffffffff';
  if (piVar4 != (int *)0x0) {
    if ((((char)*piVar4 == 'M') && (*(char *)((long)piVar4 + 1) == 'Z')) || (*piVar4 == 0x464c457f))
    {
      lVar2 = 0;
      do {
        *(byte *)((long)&local_38 + lVar2) = rar5_signature_xor[lVar2] ^ 0xa1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      lVar2 = 0x10000;
      uVar9 = 0x1000;
      min = 0x11000;
      do {
        pvVar5 = __archive_read_ahead(a,min,&local_40);
        if (pvVar5 == (void *)0x0) {
          uVar9 = (long)uVar9 >> 1;
          if (uVar9 < 0x40) {
            wVar6 = L'\0';
          }
          bVar1 = (0x3f < uVar9) + 1;
        }
        else {
          plVar8 = (long *)((long)pvVar5 + lVar2 + 8);
          plVar3 = (long *)((long)pvVar5 + lVar2);
          while (plVar8 < (long *)(local_40 + (long)pvVar5)) {
            if (*plVar3 == local_38) {
              wVar6 = L'\x1e';
              bVar1 = 1;
              goto LAB_0067da27;
            }
            plVar8 = plVar3 + 3;
            plVar3 = plVar3 + 2;
          }
          lVar2 = (long)plVar3 - (long)pvVar5;
          bVar1 = 0;
        }
LAB_0067da27:
        if ((bVar1 & 1) != 0) goto LAB_0067da3e;
        min = uVar9 + lVar2;
      } while ((long)min < 0x80001);
      bVar1 = 0;
LAB_0067da3e:
      if (bVar1 != 0) goto LAB_0067da45;
    }
    wVar6 = L'\0';
  }
LAB_0067da45:
  wVar7 = L'\xffffffff';
  if (L'\xffffffff' < wVar6) {
    wVar7 = wVar6;
  }
  return wVar7;
}

Assistant:

static int rar5_bid(struct archive_read* a, int best_bid) {
	int my_bid;

	if(best_bid > 30)
		return -1;

	my_bid = bid_standard(a);
	if(my_bid > -1) {
		return my_bid;
	}
	my_bid = bid_sfx(a);
	if (my_bid > -1) {
		return my_bid;
	}

	return -1;
}